

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

uint32_t __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsU32(AMFImporter *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  DeadlyImportError *pDVar3;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 == '\0') {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"XML_ReadNode_GetVal_AsU32. No data, seems file is corrupt.",
               &local_39);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_38);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 3) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
    uVar2 = strtoul10((char *)CONCAT44(extraout_var,iVar1),(char **)0x0);
    return uVar2;
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "XML_ReadNode_GetVal_AsU32. Invalid type of XML element, seems file is corrupt.",
             &local_39);
  DeadlyImportError::DeadlyImportError(pDVar3,&local_38);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t AMFImporter::XML_ReadNode_GetVal_AsU32()
{
	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsU32. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT) throw DeadlyImportError("XML_ReadNode_GetVal_AsU32. Invalid type of XML element, seems file is corrupt.");

	return strtoul10(mReader->getNodeData());
}